

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O2

gdImagePtr gdImageCreateFromWBMPCtx(gdIOCtx *infile)

{
  int iVar1;
  int iVar2;
  Wbmp *in_RAX;
  gdImagePtr im;
  int color;
  Wbmp *wbmp_00;
  int x;
  long lVar3;
  int y;
  Wbmp *wbmp;
  Wbmp *local_38;
  
  local_38 = in_RAX;
  iVar1 = readwbmp(gd_getin,infile,&local_38);
  if (iVar1 == 0) {
    im = gdImageCreate(local_38->width,local_38->height);
    if (im != (gdImagePtr)0x0) {
      iVar1 = gdImageColorAllocate(im,0xff,0xff,0xff);
      iVar2 = gdImageColorAllocate(im,0,0,0);
      lVar3 = 0;
      wbmp_00 = local_38;
      for (y = 0; y < wbmp_00->height; y = y + 1) {
        lVar3 = (long)(int)lVar3;
        for (x = 0; x < wbmp_00->width; x = x + 1) {
          color = iVar1;
          if (wbmp_00->bitmap[lVar3] != 1) {
            color = iVar2;
          }
          lVar3 = lVar3 + 1;
          gdImageSetPixel(im,x,y,color);
          wbmp_00 = local_38;
        }
      }
      freewbmp(wbmp_00);
      return im;
    }
    freewbmp(local_38);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromWBMPCtx(gdIOCtx *infile)
{
	Wbmp *wbmp;
	gdImagePtr im = NULL;
	int black, white;
	int col, row, pos;

	if(readwbmp(&gd_getin, infile, &wbmp)) {
		return (NULL);
	}

	if(!(im = gdImageCreate(wbmp->width, wbmp->height))) {
		freewbmp(wbmp);
		return NULL;
	}

	/* create the background color */
	white = gdImageColorAllocate(im, 255, 255, 255);
	/* create foreground color */
	black = gdImageColorAllocate(im, 0, 0, 0);

	/* fill in image (in a wbmp 1 = white/ 0 = black) */
	pos = 0;
	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width; col++) {
			if(wbmp->bitmap[pos++] == WBMP_WHITE) {
				gdImageSetPixel(im, col, row, white);
			} else {
				gdImageSetPixel(im, col, row, black);
			}
		}
	}

	freewbmp(wbmp);

	return im;
}